

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O2

size_t write_float(MIR_context_t ctx,writer_func_t writer,float fl)

{
  size_t *psVar1;
  size_t sVar2;
  undefined4 extraout_var;
  
  if (writer != (writer_func_t)0x0) {
    put_byte(ctx,writer,0x11);
    sVar2 = put_uint(ctx,writer,CONCAT44(extraout_var,fl),4);
    psVar1 = &ctx->io_ctx->output_float_len;
    *psVar1 = *psVar1 + sVar2 + 1;
    return sVar2 + 1;
  }
  return 0;
}

Assistant:

static size_t write_float (MIR_context_t ctx, writer_func_t writer, float fl) {
  size_t len;

  if (writer == NULL) return 0;
  put_byte (ctx, writer, TAG_F);
  len = put_float (ctx, writer, fl) + 1;
  output_float_len += len;
  return len;
}